

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * Cudd_bddTransfer(DdManager *ddSource,DdManager *ddDestination,DdNode *f)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *f_local;
  DdManager *ddDestination_local;
  DdManager *ddSource_local;
  
  do {
    ddDestination->reordered = 0;
    pDVar1 = cuddBddTransfer(ddSource,ddDestination,f);
  } while (ddDestination->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_bddTransfer(
  DdManager * ddSource,
  DdManager * ddDestination,
  DdNode * f)
{
    DdNode *res;
    do {
        ddDestination->reordered = 0;
        res = cuddBddTransfer(ddSource, ddDestination, f);
    } while (ddDestination->reordered == 1);
    return(res);

}